

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_vararg(lua_State *L,CallInfo *ci,LClosure *cl,int a,int b)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  StkId pTVar4;
  LuaType *pLVar5;
  long lVar6;
  ulong uVar7;
  uint n;
  uint uVar8;
  StkId pTVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  pTVar4 = (ci->u).l.base;
  uVar8 = ~(uint)cl->p->numparams + (int)((ulong)((long)pTVar4 - (long)ci->func) >> 4);
  n = ~((int)uVar8 >> 0x1f) & uVar8;
  uVar7 = (ulong)n;
  if (b < 1) {
    if ((long)L->stack_last - (long)L->top >> 4 <= (long)uVar7) {
      luaD_growstack(L,n);
      pTVar4 = (ci->u).l.base;
    }
    pTVar9 = pTVar4 + a;
    L->top = pTVar9 + uVar7;
  }
  else {
    n = b - 1;
    pTVar9 = pTVar4 + a;
  }
  if ((int)n < (int)uVar8) {
    uVar8 = n;
  }
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  else {
    lVar6 = 0;
    do {
      lVar2 = *(long *)((long)&pTVar4[-uVar7].value_ + lVar6);
      *(long *)((long)&pTVar9->value_ + lVar6) = lVar2;
      uVar1 = *(ushort *)((long)&pTVar4[-uVar7].tt_ + lVar6);
      *(ushort *)((long)&pTVar9->tt_ + lVar6) = uVar1;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar2 + 8) ||
          ((L != (lua_State *)0x0 && ((*(byte *)(lVar2 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))
          ))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xb96,"void raviV_op_vararg(lua_State *, CallInfo *, LClosure *, int, int)");
      }
      lVar6 = lVar6 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar6);
  }
  if ((int)uVar8 < (int)n) {
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pLVar5 = &pTVar9[(ulong)uVar8 + 0x1f].tt_;
    auVar14 = vpbroadcastq_avx512f();
    uVar7 = 0;
    do {
      auVar15 = vpbroadcastq_avx512f();
      auVar16 = vporq_avx512f(auVar15,auVar13);
      uVar3 = vpcmpuq_avx512f(auVar16,auVar14,2);
      if ((uVar3 & 1) != 0) {
        pLVar5[-0xf8] = 0;
      }
      if ((uVar3 & 2) != 0) {
        pLVar5[-0xf0] = 0;
      }
      if ((uVar3 & 4) != 0) {
        pLVar5[-0xe8] = 0;
      }
      if ((uVar3 & 8) != 0) {
        pLVar5[-0xe0] = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        pLVar5[-0xd8] = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        pLVar5[-0xd0] = 0;
      }
      if ((uVar3 & 0x40) != 0) {
        pLVar5[-200] = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        pLVar5[-0xc0] = 0;
      }
      auVar16 = vporq_avx512f(auVar15,auVar12);
      uVar3 = vpcmpuq_avx512f(auVar16,auVar14,2);
      if ((uVar3 & 1) != 0) {
        pLVar5[-0xb8] = 0;
      }
      if ((uVar3 & 2) != 0) {
        pLVar5[-0xb0] = 0;
      }
      if ((uVar3 & 4) != 0) {
        pLVar5[-0xa8] = 0;
      }
      if ((uVar3 & 8) != 0) {
        pLVar5[-0xa0] = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        pLVar5[-0x98] = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        pLVar5[-0x90] = 0;
      }
      if ((uVar3 & 0x40) != 0) {
        pLVar5[-0x88] = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        pLVar5[-0x80] = 0;
      }
      auVar16 = vporq_avx512f(auVar15,auVar11);
      uVar3 = vpcmpuq_avx512f(auVar16,auVar14,2);
      if ((uVar3 & 1) != 0) {
        pLVar5[-0x78] = 0;
      }
      if ((uVar3 & 2) != 0) {
        pLVar5[-0x70] = 0;
      }
      if ((uVar3 & 4) != 0) {
        pLVar5[-0x68] = 0;
      }
      if ((uVar3 & 8) != 0) {
        pLVar5[-0x60] = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        pLVar5[-0x58] = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        pLVar5[-0x50] = 0;
      }
      if ((uVar3 & 0x40) != 0) {
        pLVar5[-0x48] = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        pLVar5[-0x40] = 0;
      }
      auVar15 = vporq_avx512f(auVar15,auVar10);
      uVar3 = vpcmpuq_avx512f(auVar15,auVar14,2);
      if ((uVar3 & 1) != 0) {
        pLVar5[-0x38] = 0;
      }
      if ((uVar3 & 2) != 0) {
        pLVar5[-0x30] = 0;
      }
      if ((uVar3 & 4) != 0) {
        pLVar5[-0x28] = 0;
      }
      if ((uVar3 & 8) != 0) {
        pLVar5[-0x20] = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        pLVar5[-0x18] = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        pLVar5[-0x10] = 0;
      }
      if ((uVar3 & 0x40) != 0) {
        pLVar5[-8] = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        *pLVar5 = 0;
      }
      uVar7 = uVar7 + 0x20;
      pLVar5 = pLVar5 + 0x100;
    } while ((((ulong)n - (ulong)uVar8) + 0x1f & 0xffffffffffffffe0) != uVar7);
  }
  return;
}

Assistant:

void raviV_op_vararg(lua_State *L, CallInfo *ci, LClosure *cl, int a, int b) {
  StkId base = ci->u.l.base;
  StkId ra;
  int j;
  int n = cast_int(base - ci->func) - cl->p->numparams - 1;
  if (n < 0) /* less arguments than parameters? */
    n = 0;   /* no vararg arguments */
  b = b - 1;
  if (b < 0) { /* B == 0? */
    b = n;     /* get all var. arguments */
    Protect_base(luaD_checkstack(L, n));
    ra = base + a; /* previous call may change the stack */
    L->top = ra + n;
  }
  else {
    ra = base + a;
  }
  for (j = 0; j < b && j < n; j++) 
    setobjs2s(L, ra + j, base - n + j);
  for (; j < b; j++) /* complete required results with nil */
    setnilvalue(ra + j);
}